

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_CCtxParam_setParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int value)

{
  int iVar1;
  uint uVar2;
  ZSTD_dictAttachPref_e pref;
  
  switch(param) {
  case ZSTD_c_compressionLevel:
    if (value < 0x17) {
      uVar2 = 0xfffe0000;
      if ((-0x20001 < value) && (uVar2 = value, value == 0)) {
        uVar2 = CCtxParams->compressionLevel;
        goto LAB_0036a2ed;
      }
    }
    else {
      uVar2 = 0x16;
    }
    CCtxParams->compressionLevel = uVar2;
LAB_0036a2ed:
    if (0 < (int)uVar2) {
      return (ulong)uVar2;
    }
    return 0;
  case ZSTD_c_windowLog:
    if ((value != 0) && (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_windowLog,value), iVar1 == 0)) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).windowLog = value;
    break;
  case ZSTD_c_hashLog:
    if ((value != 0) && (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_hashLog,value), iVar1 == 0)) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).hashLog = value;
    break;
  case ZSTD_c_chainLog:
    if ((value != 0) && (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_chainLog,value), iVar1 == 0)) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).chainLog = value;
    break;
  case ZSTD_c_searchLog:
    if ((value != 0) && (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_searchLog,value), iVar1 == 0)) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).searchLog = value;
    return (long)value;
  case ZSTD_c_minMatch:
    if ((value != 0) && (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_minMatch,value), iVar1 == 0)) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).minMatch = value;
    break;
  case ZSTD_c_targetLength:
    iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_targetLength,value);
    if (iVar1 == 0) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).targetLength = value;
    break;
  case ZSTD_c_strategy:
    if ((value != 0) && (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_strategy,value), iVar1 == 0)) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).strategy = value;
    break;
  default:
    switch(param) {
    case ZSTD_c_enableLongDistanceMatching:
      (CCtxParams->ldmParams).enableLdm = (uint)(value != 0);
      return (ulong)(value != 0);
    case ZSTD_c_ldmHashLog:
      if ((value != 0) && (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmHashLog,value), iVar1 == 0)) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->ldmParams).hashLog = value;
      break;
    case ZSTD_c_ldmMinMatch:
      if ((value != 0) && (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmMinMatch,value), iVar1 == 0))
      {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->ldmParams).minMatchLength = value;
      break;
    case ZSTD_c_ldmBucketSizeLog:
      if ((value != 0) &&
         (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmBucketSizeLog,value), iVar1 == 0)) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->ldmParams).bucketSizeLog = value;
      break;
    case ZSTD_c_ldmHashRateLog:
      if (0x19 < value) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->ldmParams).hashRateLog = value;
      break;
    default:
      if (param == ZSTD_c_experimentalParam4) {
        iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam4,value);
        if (iVar1 == 0) {
          return 0xffffffffffffffd6;
        }
        CCtxParams->attachDictPref = value;
      }
      else {
        if (param == ZSTD_c_contentSizeFlag) {
          (CCtxParams->fParams).contentSizeFlag = (uint)(value != 0);
          return (ulong)(uint)(value != 0);
        }
        if (param == ZSTD_c_checksumFlag) {
          (CCtxParams->fParams).checksumFlag = (uint)(value != 0);
          return (ulong)(value != 0);
        }
        if (param == ZSTD_c_dictIDFlag) {
          (CCtxParams->fParams).noDictIDFlag = (uint)(value == 0);
          return (ulong)(value != 0);
        }
        if (param == ZSTD_c_nbWorkers) {
          if (value == 0) {
            return 0;
          }
          return 0xffffffffffffffd8;
        }
        if (param == ZSTD_c_experimentalParam3) {
          CCtxParams->forceWindow = (uint)(value != 0);
          return (ulong)(uint)(value != 0);
        }
        if (param != ZSTD_c_experimentalParam2) {
          return 0xffffffffffffffd8;
        }
        iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam2,value);
        if (iVar1 == 0) {
          return 0xffffffffffffffd6;
        }
        CCtxParams->format = value;
      }
    }
  }
  return (ulong)(uint)value;
}

Assistant:

size_t ZSTD_CCtxParam_setParameter(ZSTD_CCtx_params* CCtxParams,
                                   ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtxParam_setParameter (%i, %i)", (int)param, value);
    switch(param)
    {
    case ZSTD_c_format :
        BOUNDCHECK(ZSTD_c_format, value);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_c_compressionLevel : {
        int cLevel = value;
        if (cLevel > ZSTD_maxCLevel()) cLevel = ZSTD_maxCLevel();
        if (cLevel < ZSTD_minCLevel()) cLevel = ZSTD_minCLevel();
        if (cLevel) {  /* 0 : does not change current level */
            CCtxParams->compressionLevel = cLevel;
        }
        if (CCtxParams->compressionLevel >= 0) return CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_c_windowLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_windowLog, value);
        CCtxParams->cParams.windowLog = value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_c_hashLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_hashLog, value);
        CCtxParams->cParams.hashLog = value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_c_chainLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_chainLog, value);
        CCtxParams->cParams.chainLog = value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_c_searchLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_searchLog, value);
        CCtxParams->cParams.searchLog = value;
        return value;

    case ZSTD_c_minMatch :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_minMatch, value);
        CCtxParams->cParams.minMatch = value;
        return CCtxParams->cParams.minMatch;

    case ZSTD_c_targetLength :
        BOUNDCHECK(ZSTD_c_targetLength, value);
        CCtxParams->cParams.targetLength = value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_c_strategy :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_strategy, value);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_c_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value!=0));
        CCtxParams->fParams.contentSizeFlag = value != 0;
        return CCtxParams->fParams.contentSizeFlag;

    case ZSTD_c_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value != 0;
        return CCtxParams->fParams.checksumFlag;

    case ZSTD_c_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value!=0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_c_forceMaxWindow :
        CCtxParams->forceWindow = (value != 0);
        return CCtxParams->forceWindow;

    case ZSTD_c_forceAttachDict : {
        const ZSTD_dictAttachPref_e pref = (ZSTD_dictAttachPref_e)value;
        BOUNDCHECK(ZSTD_c_forceAttachDict, pref);
        CCtxParams->attachDictPref = pref;
        return CCtxParams->attachDictPref;
    }

    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        if (value!=0) return ERROR(parameter_unsupported);
        return 0;
#else
        return ZSTDMT_CCtxParam_setNbWorkers(CCtxParams, value);
#endif

    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_jobSize, value);
#endif

    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_overlapLog, value);
#endif

    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_rsyncable, value);
#endif

    case ZSTD_c_enableLongDistanceMatching :
        CCtxParams->ldmParams.enableLdm = (value!=0);
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_c_ldmHashLog :
        if (value!=0)   /* 0 ==> auto */
            BOUNDCHECK(ZSTD_c_ldmHashLog, value);
        CCtxParams->ldmParams.hashLog = value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_c_ldmMinMatch :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmMinMatch, value);
        CCtxParams->ldmParams.minMatchLength = value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_c_ldmBucketSizeLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmBucketSizeLog, value);
        CCtxParams->ldmParams.bucketSizeLog = value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_c_ldmHashRateLog :
        if (value > ZSTD_WINDOWLOG_MAX - ZSTD_HASHLOG_MIN)
            return ERROR(parameter_outOfBound);
        CCtxParams->ldmParams.hashRateLog = value;
        return CCtxParams->ldmParams.hashRateLog;

    default: return ERROR(parameter_unsupported);
    }
}